

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_statistics.cpp
# Opt level: O2

ParquetStatisticsUtils * __thiscall
duckdb::ParquetStatisticsUtils::ConvertValueInternal
          (ParquetStatisticsUtils *this,LogicalType *type,ParquetColumnSchema *schema_ele,
          string *stats)

{
  LogicalType LVar1;
  ParquetExtraTypeInfo PVar2;
  double *input;
  uchar uVar3;
  bool bVar4;
  char cVar5;
  short sVar6;
  int iVar7;
  long lVar8;
  InternalException *this_00;
  InvalidInputException *pIVar9;
  NotImplementedException *this_01;
  uchar uVar10;
  date_t dVar11;
  string *this_02;
  LogicalType *this_03;
  float fVar12;
  double dVar13;
  hugeint_t hVar14;
  string_t sVar15;
  hugeint_t hVar16;
  double local_148;
  long val;
  uint32_t local_138;
  allocator local_119;
  double local_118;
  LogicalType local_110 [24];
  LogicalType local_f8 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0 [32];
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  anon_union_16_2_67f50693_for_value local_40;
  
  if (0x2c < (byte)*type - 10) {
switchD_002f4975_caseD_11:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&val,"Unsupported type for stats %s",(allocator *)&local_148);
    duckdb::LogicalType::ToString_abi_cxx11_();
    InternalException::InternalException<std::__cxx11::string>(this_00,(string *)&val,&local_e0);
    __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  input = (double *)(stats->_M_dataplus)._M_p;
  dVar11.days = (int32_t)this;
  switch((uint)(byte)*type) {
  case 10:
    if (stats->_M_string_length != 1) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&val,"Incorrect stats size for type BOOLEAN",(allocator *)&local_148);
      duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&val);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    duckdb::Value::BOOLEAN(SUB81(this,0));
    break;
  case 0xb:
  case 0xc:
  case 0xd:
    if (stats->_M_string_length != 4) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&val,"Incorrect stats size for type INTEGER",(allocator *)&local_148);
      duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&val);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    duckdb::Value::INTEGER(dVar11.days);
    break;
  case 0xe:
    if (stats->_M_string_length != 8) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&val,"Incorrect stats size for type BIGINT",(allocator *)&local_148);
      duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&val);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    duckdb::Value::BIGINT((long)this);
    break;
  case 0xf:
    if (stats->_M_string_length != 4) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&val,"Incorrect stats size for type DATE",(allocator *)&local_148);
      duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&val);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    duckdb::Value::DATE(dVar11);
    break;
  case 0x10:
    if (stats->_M_string_length == 8) {
      dVar13 = *input;
    }
    else {
      if (stats->_M_string_length != 4) {
        pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&val,"Incorrect stats size for type TIME",(allocator *)&local_148);
        duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&val);
        __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
      }
      dVar13 = (double)(long)*(int *)input;
    }
    if (schema_ele->type_info == UNIT_NS) {
      duckdb::Time::FromTimeNs((long)dVar13);
    }
    else if (schema_ele->type_info == UNIT_MS) {
      duckdb::Time::FromTimeMs((long)dVar13);
    }
    duckdb::Value::TIME((dtime_t)this);
    break;
  default:
    goto switchD_002f4975_caseD_11;
  case 0x13:
  case 0x20:
    PVar2 = schema_ele->type_info;
    if (PVar2 == IMPALA_TIMESTAMP) {
      if (stats->_M_string_length != 0xc) {
        pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&val,"Incorrect stats size for type TIMESTAMP",(allocator *)&local_148)
        ;
        duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&val);
        __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
      }
      val = (long)*input;
      local_138 = *(uint32_t *)(input + 1);
      ImpalaTimestampToTimestamp((Int96 *)&val);
    }
    else {
      if (stats->_M_string_length != 8) {
        pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&val,"Incorrect stats size for type TIMESTAMP",(allocator *)&local_148)
        ;
        duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&val);
        __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
      }
      if (PVar2 == UNIT_NS) {
        duckdb::Timestamp::FromEpochNanoSeconds((long)*input);
      }
      else if (PVar2 == UNIT_MS) {
        duckdb::Timestamp::FromEpochMs((long)*input);
      }
    }
    if (*type == (LogicalType)0x20) {
      duckdb::Value::TIMESTAMPTZ((timestamp_tz_t)this);
    }
    else {
      duckdb::Value::TIMESTAMP((timestamp_t)this);
    }
    break;
  case 0x14:
    PVar2 = schema_ele->type_info;
    if (PVar2 == IMPALA_TIMESTAMP) {
      if (stats->_M_string_length != 0xc) {
        pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&val,"Incorrect stats size for type TIMESTAMP_NS",
                   (allocator *)&local_148);
        duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&val);
        __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
      }
      val = (long)*input;
      local_138 = *(uint32_t *)(input + 1);
      ImpalaTimestampToTimestampNS((Int96 *)&val);
    }
    else {
      if (stats->_M_string_length != 8) {
        pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&val,"Incorrect stats size for type TIMESTAMP_NS",
                   (allocator *)&local_148);
        duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&val);
        __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
      }
      val = (long)*input;
      if (PVar2 == UNIT_NS) {
        ParquetTimestampNsToTimestampNs(&val);
      }
      else if (PVar2 == UNIT_MS) {
        ParquetTimestampMsToTimestampNs(&val);
      }
      else {
        ParquetTimestampUsToTimestampNs(&val);
      }
    }
    duckdb::Value::TIMESTAMPNS((timestamp_ns_t)this);
    break;
  case 0x15:
    uVar3 = duckdb::DecimalType::GetWidth(type);
    duckdb::DecimalType::GetScale(type);
    PVar2 = schema_ele->type_info;
    if (PVar2 == DECIMAL_BYTE_ARRAY) {
      LVar1 = type[1];
      if (LVar1 == (LogicalType)0xcc) {
        hVar14 = ParquetDecimalUtils::ReadDecimalValue<duckdb::hugeint_t>
                           ((const_data_ptr_t)input,stats->_M_string_length,schema_ele);
        hVar16.upper = hVar14.lower;
        hVar16.lower = (uint64_t)this;
        duckdb::Value::DECIMAL(hVar16,(uchar)hVar14.upper,uVar3);
        return this;
      }
      if (LVar1 != (LogicalType)0x7) {
        if (LVar1 != (LogicalType)0x9) {
          if (LVar1 == (LogicalType)0x5) {
            sVar6 = ParquetDecimalUtils::ReadDecimalValue<short>
                              ((const_data_ptr_t)input,stats->_M_string_length,schema_ele);
            duckdb::Value::DECIMAL((short)this,(uchar)sVar6,uVar3);
            return this;
          }
          pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&val,"Unsupported internal type for decimal",(allocator *)&local_148)
          ;
          duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&val);
          __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
        }
        lVar8 = ParquetDecimalUtils::ReadDecimalValue<long>
                          ((const_data_ptr_t)input,stats->_M_string_length,schema_ele);
        uVar10 = (uchar)lVar8;
        goto LAB_002f4e96;
      }
      iVar7 = ParquetDecimalUtils::ReadDecimalValue<int>
                        ((const_data_ptr_t)input,stats->_M_string_length,schema_ele);
      uVar10 = (uchar)iVar7;
    }
    else {
      if (PVar2 == DECIMAL_INT64) {
        if (stats->_M_string_length != 8) {
          pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string
                    ((string *)&val,"Incorrect stats size for type %s",(allocator *)&local_148);
          duckdb::LogicalType::ToString_abi_cxx11_();
          InvalidInputException::InvalidInputException<std::__cxx11::string>
                    (pIVar9,(string *)&val,&local_80);
          __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
        }
        uVar10 = SUB81(*input,0);
LAB_002f4e96:
        duckdb::Value::DECIMAL((long)this,uVar10,uVar3);
        return this;
      }
      if (PVar2 != DECIMAL_INT32) {
        this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&val,"Unrecognized Parquet type for Decimal",(allocator *)&local_148);
        duckdb::NotImplementedException::NotImplementedException(this_01,(string *)&val);
        __cxa_throw(this_01,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
      }
      if (stats->_M_string_length != 4) {
        pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&val,"Incorrect stats size for type %s",(allocator *)&local_148);
        duckdb::LogicalType::ToString_abi_cxx11_();
        InvalidInputException::InvalidInputException<std::__cxx11::string>
                  (pIVar9,(string *)&val,&local_60);
        __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar10 = (uchar)*(undefined4 *)input;
    }
    duckdb::Value::DECIMAL(dVar11.days,uVar10,uVar3);
    break;
  case 0x16:
    if (schema_ele->type_info == FLOAT16) {
      if (stats->_M_string_length != 2) {
        pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&val,"Incorrect stats size for type FLOAT16",(allocator *)&local_148);
        duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&val);
        __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
      }
      val = CONCAT62(val._2_6_,*(undefined2 *)input);
      fVar12 = Float16ToFloat32((uint16_t *)&val);
    }
    else {
      if (stats->_M_string_length != 4) {
        pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&val,"Incorrect stats size for type FLOAT",(allocator *)&local_148);
        duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&val);
        __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
      }
      fVar12 = *(float *)input;
    }
    local_118 = (double)CONCAT44(local_118._4_4_,fVar12);
    cVar5 = duckdb::Value::FloatIsFinite(fVar12);
    if (cVar5 != '\0') {
      duckdb::Value::FLOAT(local_118._0_4_);
      return this;
    }
    duckdb::LogicalType::LogicalType(local_f8,SQLNULL);
    duckdb::Value::Value((Value *)this,local_f8);
    this_03 = local_f8;
LAB_002f4e53:
    duckdb::LogicalType::~LogicalType(this_03);
    break;
  case 0x17:
    if (schema_ele->type_info == DECIMAL_BYTE_ARRAY) {
      dVar13 = ParquetDecimalUtils::ReadDecimalValue<double>
                         ((const_data_ptr_t)input,stats->_M_string_length,schema_ele);
    }
    else {
      if (stats->_M_string_length != 8) {
        pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&val,"Incorrect stats size for type DOUBLE",(allocator *)&local_148);
        duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&val);
        __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
      }
      local_118 = *input;
      cVar5 = duckdb::Value::DoubleIsFinite(local_118);
      dVar13 = local_118;
      if (cVar5 == '\0') {
        duckdb::LogicalType::LogicalType(local_110,SQLNULL);
        duckdb::Value::Value((Value *)this,local_110);
        this_03 = local_110;
        goto LAB_002f4e53;
      }
    }
    duckdb::Value::DOUBLE(dVar13);
    break;
  case 0x19:
    bVar4 = Value::StringIsValid(stats);
    if (!bVar4) goto switchD_002f4975_caseD_1a;
    std::__cxx11::string::string(local_c0,(string *)stats);
    duckdb::Value::Value((Value *)this,local_c0);
    this_02 = local_c0;
    goto LAB_002f4b73;
  case 0x1a:
switchD_002f4975_caseD_1a:
    string_t::string_t((string_t *)&local_40.pointer,stats);
    sVar15.value.pointer.ptr = (char *)local_40._0_8_;
    sVar15.value._0_8_ = local_a0;
    duckdb::Blob::ToString_abi_cxx11_(sVar15);
    duckdb::Value::Value((Value *)this,local_a0);
    this_02 = local_a0;
LAB_002f4b73:
    std::__cxx11::string::~string(this_02);
    break;
  case 0x1c:
  case 0x1d:
  case 0x1e:
    if (stats->_M_string_length != 4) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&val,"Incorrect stats size for type UINTEGER",(allocator *)&local_148);
      duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&val);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    duckdb::Value::UINTEGER(dVar11.days);
    break;
  case 0x1f:
    if (stats->_M_string_length != 8) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&val,"Incorrect stats size for type UBIGINT",(allocator *)&local_148);
      duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&val);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    duckdb::Value::UBIGINT((ulong)this);
    break;
  case 0x22:
    if (stats->_M_string_length == 8) {
      local_148 = *input;
    }
    else {
      if (stats->_M_string_length != 4) {
        pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string
                  ((string *)&val,"Incorrect stats size for type TIMETZ",&local_119);
        duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&val);
        __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
      }
      local_148 = (double)(long)*(int *)input;
    }
    if (schema_ele->type_info == UNIT_NS) {
      ParquetIntToTimeNsTZ((int64_t *)&local_148);
    }
    else if (schema_ele->type_info == UNIT_MS) {
      iVar7 = NumericCastImpl<int,_long,_false>::Convert((long)local_148);
      val = CONCAT44(val._4_4_,iVar7);
      ParquetIntToTimeMsTZ((int32_t *)&val);
    }
    else {
      ParquetIntToTimeTZ((int64_t *)&local_148);
    }
    duckdb::Value::TIMETZ((dtime_tz_t)this);
    break;
  case 0x36:
    if (stats->_M_string_length != 0x10) {
      pIVar9 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&val,"Incorrect stats size for type UUID",(allocator *)&local_148);
      duckdb::InvalidInputException::InvalidInputException(pIVar9,(string *)&val);
      __cxa_throw(pIVar9,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    hVar14 = UUIDValueConversion::ReadParquetUUID((const_data_ptr_t)input);
    hVar14.upper = hVar14.lower;
    hVar14.lower = (uint64_t)this;
    duckdb::Value::UUID(hVar14);
  }
  return this;
}

Assistant:

Value ParquetStatisticsUtils::ConvertValueInternal(const LogicalType &type, const ParquetColumnSchema &schema_ele,
                                                   const std::string &stats) {
	auto stats_data = const_data_ptr_cast(stats.c_str());
	switch (type.id()) {
	case LogicalTypeId::BOOLEAN: {
		if (stats.size() != sizeof(bool)) {
			throw InvalidInputException("Incorrect stats size for type BOOLEAN");
		}
		return Value::BOOLEAN(Load<bool>(stats_data));
	}
	case LogicalTypeId::UTINYINT:
	case LogicalTypeId::USMALLINT:
	case LogicalTypeId::UINTEGER:
		if (stats.size() != sizeof(uint32_t)) {
			throw InvalidInputException("Incorrect stats size for type UINTEGER");
		}
		return Value::UINTEGER(Load<uint32_t>(stats_data));
	case LogicalTypeId::UBIGINT:
		if (stats.size() != sizeof(uint64_t)) {
			throw InvalidInputException("Incorrect stats size for type UBIGINT");
		}
		return Value::UBIGINT(Load<uint64_t>(stats_data));
	case LogicalTypeId::TINYINT:
	case LogicalTypeId::SMALLINT:
	case LogicalTypeId::INTEGER:
		if (stats.size() != sizeof(int32_t)) {
			throw InvalidInputException("Incorrect stats size for type INTEGER");
		}
		return Value::INTEGER(Load<int32_t>(stats_data));
	case LogicalTypeId::BIGINT:
		if (stats.size() != sizeof(int64_t)) {
			throw InvalidInputException("Incorrect stats size for type BIGINT");
		}
		return Value::BIGINT(Load<int64_t>(stats_data));
	case LogicalTypeId::FLOAT: {
		float val;
		if (schema_ele.type_info == ParquetExtraTypeInfo::FLOAT16) {
			if (stats.size() != sizeof(uint16_t)) {
				throw InvalidInputException("Incorrect stats size for type FLOAT16");
			}
			val = Float16ToFloat32(Load<uint16_t>(stats_data));
		} else {
			if (stats.size() != sizeof(float)) {
				throw InvalidInputException("Incorrect stats size for type FLOAT");
			}
			val = Load<float>(stats_data);
		}
		if (!Value::FloatIsFinite(val)) {
			return Value();
		}
		return Value::FLOAT(val);
	}
	case LogicalTypeId::DOUBLE: {
		if (schema_ele.type_info == ParquetExtraTypeInfo::DECIMAL_BYTE_ARRAY) {
			// decimals cast to double
			return Value::DOUBLE(ParquetDecimalUtils::ReadDecimalValue<double>(stats_data, stats.size(), schema_ele));
		}
		if (stats.size() != sizeof(double)) {
			throw InvalidInputException("Incorrect stats size for type DOUBLE");
		}
		auto val = Load<double>(stats_data);
		if (!Value::DoubleIsFinite(val)) {
			return Value();
		}
		return Value::DOUBLE(val);
	}
	case LogicalTypeId::DECIMAL: {
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		switch (schema_ele.type_info) {
		case ParquetExtraTypeInfo::DECIMAL_INT32:
			if (stats.size() != sizeof(int32_t)) {
				throw InvalidInputException("Incorrect stats size for type %s", type.ToString());
			}
			return Value::DECIMAL(Load<int32_t>(stats_data), width, scale);
		case ParquetExtraTypeInfo::DECIMAL_INT64:
			if (stats.size() != sizeof(int64_t)) {
				throw InvalidInputException("Incorrect stats size for type %s", type.ToString());
			}
			return Value::DECIMAL(Load<int64_t>(stats_data), width, scale);
		case ParquetExtraTypeInfo::DECIMAL_BYTE_ARRAY:
			switch (type.InternalType()) {
			case PhysicalType::INT16:
				return Value::DECIMAL(
				    ParquetDecimalUtils::ReadDecimalValue<int16_t>(stats_data, stats.size(), schema_ele), width, scale);
			case PhysicalType::INT32:
				return Value::DECIMAL(
				    ParquetDecimalUtils::ReadDecimalValue<int32_t>(stats_data, stats.size(), schema_ele), width, scale);
			case PhysicalType::INT64:
				return Value::DECIMAL(
				    ParquetDecimalUtils::ReadDecimalValue<int64_t>(stats_data, stats.size(), schema_ele), width, scale);
			case PhysicalType::INT128:
				return Value::DECIMAL(
				    ParquetDecimalUtils::ReadDecimalValue<hugeint_t>(stats_data, stats.size(), schema_ele), width,
				    scale);
			default:
				throw InvalidInputException("Unsupported internal type for decimal");
			}
		default:
			throw NotImplementedException("Unrecognized Parquet type for Decimal");
		}
	}
	case LogicalTypeId::VARCHAR:
	case LogicalTypeId::BLOB:
		if (type.id() == LogicalTypeId::BLOB || !Value::StringIsValid(stats)) {
			return Value(Blob::ToString(string_t(stats)));
		}
		return Value(stats);
	case LogicalTypeId::DATE:
		if (stats.size() != sizeof(int32_t)) {
			throw InvalidInputException("Incorrect stats size for type DATE");
		}
		return Value::DATE(date_t(Load<int32_t>(stats_data)));
	case LogicalTypeId::TIME: {
		int64_t val;
		if (stats.size() == sizeof(int32_t)) {
			val = Load<int32_t>(stats_data);
		} else if (stats.size() == sizeof(int64_t)) {
			val = Load<int64_t>(stats_data);
		} else {
			throw InvalidInputException("Incorrect stats size for type TIME");
		}
		switch (schema_ele.type_info) {
		case ParquetExtraTypeInfo::UNIT_MS:
			return Value::TIME(Time::FromTimeMs(val));
		case ParquetExtraTypeInfo::UNIT_NS:
			return Value::TIME(Time::FromTimeNs(val));
		case ParquetExtraTypeInfo::UNIT_MICROS:
		default:
			return Value::TIME(dtime_t(val));
		}
	}
	case LogicalTypeId::TIME_TZ: {
		int64_t val;
		if (stats.size() == sizeof(int32_t)) {
			val = Load<int32_t>(stats_data);
		} else if (stats.size() == sizeof(int64_t)) {
			val = Load<int64_t>(stats_data);
		} else {
			throw InvalidInputException("Incorrect stats size for type TIMETZ");
		}
		switch (schema_ele.type_info) {
		case ParquetExtraTypeInfo::UNIT_MS:
			return Value::TIMETZ(ParquetIntToTimeMsTZ(NumericCast<int32_t>(val)));
		case ParquetExtraTypeInfo::UNIT_NS:
			return Value::TIMETZ(ParquetIntToTimeNsTZ(val));
		case ParquetExtraTypeInfo::UNIT_MICROS:
		default:
			return Value::TIMETZ(ParquetIntToTimeTZ(val));
		}
	}
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ: {
		timestamp_t timestamp_value;
		if (schema_ele.type_info == ParquetExtraTypeInfo::IMPALA_TIMESTAMP) {
			if (stats.size() != sizeof(Int96)) {
				throw InvalidInputException("Incorrect stats size for type TIMESTAMP");
			}
			timestamp_value = ImpalaTimestampToTimestamp(Load<Int96>(stats_data));
		} else {
			if (stats.size() != sizeof(int64_t)) {
				throw InvalidInputException("Incorrect stats size for type TIMESTAMP");
			}
			auto val = Load<int64_t>(stats_data);
			switch (schema_ele.type_info) {
			case ParquetExtraTypeInfo::UNIT_MS:
				timestamp_value = Timestamp::FromEpochMs(val);
				break;
			case ParquetExtraTypeInfo::UNIT_NS:
				timestamp_value = Timestamp::FromEpochNanoSeconds(val);
				break;
			case ParquetExtraTypeInfo::UNIT_MICROS:
			default:
				timestamp_value = timestamp_t(val);
				break;
			}
		}
		if (type.id() == LogicalTypeId::TIMESTAMP_TZ) {
			return Value::TIMESTAMPTZ(timestamp_tz_t(timestamp_value));
		}
		return Value::TIMESTAMP(timestamp_value);
	}
	case LogicalTypeId::TIMESTAMP_NS: {
		timestamp_ns_t timestamp_value;
		if (schema_ele.type_info == ParquetExtraTypeInfo::IMPALA_TIMESTAMP) {
			if (stats.size() != sizeof(Int96)) {
				throw InvalidInputException("Incorrect stats size for type TIMESTAMP_NS");
			}
			timestamp_value = ImpalaTimestampToTimestampNS(Load<Int96>(stats_data));
		} else {
			if (stats.size() != sizeof(int64_t)) {
				throw InvalidInputException("Incorrect stats size for type TIMESTAMP_NS");
			}
			auto val = Load<int64_t>(stats_data);
			switch (schema_ele.type_info) {
			case ParquetExtraTypeInfo::UNIT_MS:
				timestamp_value = ParquetTimestampMsToTimestampNs(val);
				break;
			case ParquetExtraTypeInfo::UNIT_NS:
				timestamp_value = ParquetTimestampNsToTimestampNs(val);
				break;
			case ParquetExtraTypeInfo::UNIT_MICROS:
			default:
				timestamp_value = ParquetTimestampUsToTimestampNs(val);
				break;
			}
		}
		return Value::TIMESTAMPNS(timestamp_value);
	}
	case LogicalTypeId::UUID: {
		if (stats.size() != 16) {
			throw InvalidInputException("Incorrect stats size for type UUID");
		}
		auto uuid_val = UUIDValueConversion::ReadParquetUUID(const_data_ptr_cast(stats.c_str()));
		return Value::UUID(uuid_val);
	}
	default:
		throw InternalException("Unsupported type for stats %s", type.ToString());
	}
}